

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

unique_ptr<Catch::TestSpec::TagPattern> __thiscall
Catch::Detail::make_unique<Catch::TestSpec::TagPattern,char_const(&)[2],std::__cxx11::string&>
          (Detail *this,char (*args) [2],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  TagPattern *this_00;
  size_t sVar1;
  string local_48;
  
  this_00 = (TagPattern *)operator_new(0x48);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar1 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,args,*args + sVar1);
  TestSpec::TagPattern::TagPattern(this_00,&local_48,args_1);
  *(TagPattern **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return (unique_ptr<Catch::TestSpec::TagPattern>)(TagPattern *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        // static_cast<Args&&> does the same thing as std::forward in
        // this case, but does not require including big header (<utility>)
        // and compiles faster thanks to not requiring template instantiation
        // and overload resolution
        return unique_ptr<T>(new T(static_cast<Args&&>(args)...));
    }